

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O1

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  
  if (strict != 0) {
LAB_003f2b92:
    iVar1 = format_octal(v,p,s);
    return iVar1;
  }
  if (s <= maxsize && -1 < v) {
    lVar3 = 1L << ((char)s * '\x03' & 0x3fU);
    do {
      if (v < lVar3) goto LAB_003f2b92;
      s = s + 1;
      lVar3 = lVar3 << 3;
    } while (maxsize + 1 != s);
  }
  pbVar2 = (byte *)(p + (uint)maxsize);
  if (0 < maxsize) {
    iVar1 = maxsize + 1;
    do {
      pbVar2[-1] = (byte)v;
      pbVar2 = pbVar2 + -1;
      v = v >> 8;
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  *pbVar2 = *pbVar2 | 0x80;
  return 0;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize)
{
	int64_t limit = ((int64_t)1 << (s*3));

	if (v < limit)
		return (format_octal(v, p, s));
	return (format_256(v, p, maxsize));
}